

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationObject.cpp
# Opt level: O3

bool Js::VarIsImpl<Js::ActivationObject>(RecyclableObject *instance)

{
  _func_int **pp_Var1;
  bool bVar2;
  
  pp_Var1 = (instance->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject;
  bVar2 = true;
  if ((((((pp_Var1 != (_func_int **)VirtualTableInfo<Js::ActivationObject>::Address) &&
         (pp_Var1 !=
          (_func_int **)VirtualTableInfo<Js::CrossSiteObject<Js::ActivationObject>_>::Address)) &&
        (pp_Var1 != (_func_int **)VirtualTableInfo<Js::ActivationObjectEx>::Address)) &&
       ((pp_Var1 !=
         (_func_int **)VirtualTableInfo<Js::CrossSiteObject<Js::ActivationObjectEx>_>::Address &&
        (pp_Var1 != (_func_int **)VirtualTableInfo<Js::PseudoActivationObject>::Address)))) &&
      ((pp_Var1 !=
        (_func_int **)VirtualTableInfo<Js::CrossSiteObject<Js::PseudoActivationObject>_>::Address &&
       ((pp_Var1 != (_func_int **)VirtualTableInfo<Js::BlockActivationObject>::Address &&
        (pp_Var1 !=
         (_func_int **)VirtualTableInfo<Js::CrossSiteObject<Js::BlockActivationObject>_>::Address)))
       ))) && (pp_Var1 != (_func_int **)VirtualTableInfo<Js::ConsoleScopeActivationObject>::Address)
     ) {
    bVar2 = pp_Var1 ==
            (_func_int **)
            VirtualTableInfo<Js::CrossSiteObject<Js::ConsoleScopeActivationObject>_>::Address;
  }
  return bVar2;
}

Assistant:

bool VarIsImpl<ActivationObject>(RecyclableObject* instance)
    {
        return VirtualTableInfo<ActivationObject>::HasVirtualTable(instance) ||
            VirtualTableInfo<CrossSiteObject<ActivationObject>>::HasVirtualTable(instance) ||
            VirtualTableInfo<ActivationObjectEx>::HasVirtualTable(instance) ||
            VirtualTableInfo<CrossSiteObject<ActivationObjectEx>>::HasVirtualTable(instance) ||
            VirtualTableInfo<PseudoActivationObject>::HasVirtualTable(instance) ||
            VirtualTableInfo<CrossSiteObject<PseudoActivationObject>>::HasVirtualTable(instance) ||
            VirtualTableInfo<BlockActivationObject>::HasVirtualTable(instance) ||
            VirtualTableInfo<CrossSiteObject<BlockActivationObject>>::HasVirtualTable(instance) ||
            VirtualTableInfo<ConsoleScopeActivationObject>::HasVirtualTable(instance) ||
            VirtualTableInfo<CrossSiteObject<ConsoleScopeActivationObject>>::HasVirtualTable(instance);
    }